

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ParenthesizedExpressionSyntax *args_2;
  CastExpressionSyntax *pCVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x797de6);
  args_2 = (ParenthesizedExpressionSyntax *)
           deepClone<slang::syntax::ExpressionSyntax>
                     ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)0x797e23);
  deepClone<slang::syntax::ParenthesizedExpressionSyntax>
            ((ParenthesizedExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CastExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax&>
                     (this,(ExpressionSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CastExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CastExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.apostrophe.deepClone(alloc),
        *deepClone<ParenthesizedExpressionSyntax>(*node.right, alloc)
    );
}